

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O1

void __thiscall CSubNet::CSubNet(CSubNet *this,CNetAddr *addr)

{
  Network NVar1;
  uint uVar2;
  long lVar3;
  uint32_t uVar4;
  uint uVar5;
  long in_FS_OFFSET;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  CNetAddr::CNetAddr(&this->network);
  this->valid = false;
  this->netmask[0] = '\0';
  this->netmask[1] = '\0';
  this->netmask[2] = '\0';
  this->netmask[3] = '\0';
  this->netmask[4] = '\0';
  this->netmask[5] = '\0';
  this->netmask[6] = '\0';
  this->netmask[7] = '\0';
  this->netmask[8] = '\0';
  this->netmask[9] = '\0';
  this->netmask[10] = '\0';
  this->netmask[0xb] = '\0';
  this->netmask[0xc] = '\0';
  this->netmask[0xd] = '\0';
  this->netmask[0xe] = '\0';
  this->netmask[0xf] = '\0';
  NVar1 = addr->m_net;
  if (NVar1 < 8) {
    if ((0x38U >> (NVar1 & 0x1f) & 1) == 0) {
      if ((0xc1U >> (NVar1 & 0x1f) & 1) != 0) goto LAB_006abfc6;
      this->valid = true;
      uVar2 = (addr->m_addr)._size;
      uVar5 = uVar2 - 0x11;
      if (uVar2 < 0x11) {
        uVar5 = uVar2;
      }
      if (0x10 < uVar5) {
        __assert_fail("addr.m_addr.size() <= sizeof(netmask)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/netaddress.cpp"
                      ,1000,"CSubNet::CSubNet(const CNetAddr &)");
      }
      memset(this->netmask,0xff,(ulong)uVar5);
    }
    else {
      this->valid = true;
    }
  }
  prevector<16U,_unsigned_char,_unsigned_int,_int>::operator=
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)this,&addr->m_addr);
  uVar4 = addr->m_scope_id;
  (this->network).m_net = addr->m_net;
  (this->network).m_scope_id = uVar4;
LAB_006abfc6:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CSubNet::CSubNet(const CNetAddr& addr) : CSubNet()
{
    switch (addr.m_net) {
    case NET_IPV4:
    case NET_IPV6:
        valid = true;
        assert(addr.m_addr.size() <= sizeof(netmask));
        memset(netmask, 0xFF, addr.m_addr.size());
        break;
    case NET_ONION:
    case NET_I2P:
    case NET_CJDNS:
        valid = true;
        break;
    case NET_INTERNAL:
    case NET_UNROUTABLE:
    case NET_MAX:
        return;
    }

    network = addr;
}